

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O3

string * google::Munge(string *__return_storage_ptr__,string *filename)

{
  _Alloc_hider _Var1;
  string *psVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  int err;
  int err_00;
  int err_01;
  int err_02;
  int err_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string line;
  char null_str [256];
  char ptr_str [256];
  char buf [4096];
  long *local_12b0;
  char *local_12a8;
  long local_12a0 [2];
  string local_1290;
  string *local_1270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1268;
  string local_1260;
  FILE *local_1240;
  string local_1238 [8];
  char local_1138 [256];
  LogMessage local_1038 [256];
  
  local_1240 = fopen((filename->_M_dataplus)._M_p,"rb");
  if (local_1240 != (FILE *)0x0) {
    local_1268 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1268;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    pcVar4 = fgets((char *)local_1038,0xfff,local_1240);
    if (pcVar4 != (char *)0x0) {
      local_1270 = __return_storage_ptr__;
      do {
        local_1238[0]._M_dataplus._M_p = (pointer)&local_1238[0].field_2;
        sVar5 = strlen((char *)local_1038);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1238,local_1038,(long)&local_1038[0].allocated_ + sVar5);
        MungeLine(&local_1260,local_1238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1238[0]._M_dataplus._M_p != &local_1238[0].field_2) {
          operator_delete(local_1238[0]._M_dataplus._M_p,
                          local_1238[0].field_2._M_allocated_capacity + 1);
        }
        sprintf((char *)local_1238,"%p",0);
        sprintf(local_1138,"%p",0x12345678);
        local_12b0 = local_12a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b0,"__NULLP__","");
        local_1290._M_dataplus._M_p = (pointer)&local_1290.field_2;
        sVar5 = strlen((char *)local_1238);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1290,local_1238,(long)&local_1238[0]._M_dataplus._M_p + sVar5);
        uVar6 = std::__cxx11::string::find((char *)&local_1260,(ulong)local_12b0,0);
        _Var1._M_p = local_1290._M_dataplus._M_p;
        pcVar4 = local_12a8;
        if (uVar6 != 0xffffffffffffffff) {
          strlen(local_1290._M_dataplus._M_p);
          std::__cxx11::string::replace((ulong)&local_1260,uVar6,pcVar4,(ulong)_Var1._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
          operator_delete(local_1290._M_dataplus._M_p,local_1290.field_2._M_allocated_capacity + 1);
        }
        if (local_12b0 != local_12a0) {
          operator_delete(local_12b0,local_12a0[0] + 1);
        }
        local_12b0 = local_12a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b0,"__PTRTEST__","");
        local_1290._M_dataplus._M_p = (pointer)&local_1290.field_2;
        sVar5 = strlen(local_1138);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1290,local_1138,local_1138 + sVar5);
        uVar6 = std::__cxx11::string::find((char *)&local_1260,(ulong)local_12b0,0);
        _Var1._M_p = local_1290._M_dataplus._M_p;
        pcVar4 = local_12a8;
        if (uVar6 != 0xffffffffffffffff) {
          strlen(local_1290._M_dataplus._M_p);
          std::__cxx11::string::replace((ulong)&local_1260,uVar6,pcVar4,(ulong)_Var1._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
          operator_delete(local_1290._M_dataplus._M_p,local_1290.field_2._M_allocated_capacity + 1);
        }
        if (local_12b0 != local_12a0) {
          operator_delete(local_12b0,local_12a0[0] + 1);
        }
        local_12b0 = local_12a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b0,"__SUCCESS__","");
        StrError_abi_cxx11_(&local_1290,(google *)0x0,err);
        uVar6 = std::__cxx11::string::find((char *)&local_1260,(ulong)local_12b0,0);
        _Var1._M_p = local_1290._M_dataplus._M_p;
        pcVar4 = local_12a8;
        if (uVar6 != 0xffffffffffffffff) {
          strlen(local_1290._M_dataplus._M_p);
          std::__cxx11::string::replace((ulong)&local_1260,uVar6,pcVar4,(ulong)_Var1._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
          operator_delete(local_1290._M_dataplus._M_p,local_1290.field_2._M_allocated_capacity + 1);
        }
        if (local_12b0 != local_12a0) {
          operator_delete(local_12b0,local_12a0[0] + 1);
        }
        local_12b0 = local_12a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b0,"__ENOENT__","");
        StrError_abi_cxx11_(&local_1290,(google *)0x2,err_00);
        uVar6 = std::__cxx11::string::find((char *)&local_1260,(ulong)local_12b0,0);
        _Var1._M_p = local_1290._M_dataplus._M_p;
        pcVar4 = local_12a8;
        if (uVar6 != 0xffffffffffffffff) {
          strlen(local_1290._M_dataplus._M_p);
          std::__cxx11::string::replace((ulong)&local_1260,uVar6,pcVar4,(ulong)_Var1._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
          operator_delete(local_1290._M_dataplus._M_p,local_1290.field_2._M_allocated_capacity + 1);
        }
        if (local_12b0 != local_12a0) {
          operator_delete(local_12b0,local_12a0[0] + 1);
        }
        local_12b0 = local_12a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b0,"__EINTR__","");
        StrError_abi_cxx11_(&local_1290,(google *)0x4,err_01);
        uVar6 = std::__cxx11::string::find((char *)&local_1260,(ulong)local_12b0,0);
        _Var1._M_p = local_1290._M_dataplus._M_p;
        pcVar4 = local_12a8;
        if (uVar6 != 0xffffffffffffffff) {
          strlen(local_1290._M_dataplus._M_p);
          std::__cxx11::string::replace((ulong)&local_1260,uVar6,pcVar4,(ulong)_Var1._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
          operator_delete(local_1290._M_dataplus._M_p,local_1290.field_2._M_allocated_capacity + 1);
        }
        if (local_12b0 != local_12a0) {
          operator_delete(local_12b0,local_12a0[0] + 1);
        }
        local_12b0 = local_12a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b0,"__ENXIO__","");
        StrError_abi_cxx11_(&local_1290,(google *)0x6,err_02);
        uVar6 = std::__cxx11::string::find((char *)&local_1260,(ulong)local_12b0,0);
        _Var1._M_p = local_1290._M_dataplus._M_p;
        pcVar4 = local_12a8;
        if (uVar6 != 0xffffffffffffffff) {
          strlen(local_1290._M_dataplus._M_p);
          std::__cxx11::string::replace((ulong)&local_1260,uVar6,pcVar4,(ulong)_Var1._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
          operator_delete(local_1290._M_dataplus._M_p,local_1290.field_2._M_allocated_capacity + 1);
        }
        if (local_12b0 != local_12a0) {
          operator_delete(local_12b0,local_12a0[0] + 1);
        }
        local_12b0 = local_12a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b0,"__ENOEXEC__","");
        StrError_abi_cxx11_(&local_1290,(google *)0x8,err_03);
        uVar6 = std::__cxx11::string::find((char *)&local_1260,(ulong)local_12b0,0);
        _Var1._M_p = local_1290._M_dataplus._M_p;
        pcVar4 = local_12a8;
        if (uVar6 != 0xffffffffffffffff) {
          strlen(local_1290._M_dataplus._M_p);
          std::__cxx11::string::replace((ulong)&local_1260,uVar6,pcVar4,(ulong)_Var1._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
          operator_delete(local_1290._M_dataplus._M_p,local_1290.field_2._M_allocated_capacity + 1);
        }
        psVar2 = local_1270;
        if (local_12b0 != local_12a0) {
          operator_delete(local_12b0,local_12a0[0] + 1);
        }
        local_12b0 = local_12a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_12b0,local_1260._M_dataplus._M_p,
                   local_1260._M_dataplus._M_p + local_1260._M_string_length);
        std::__cxx11::string::append((char *)&local_12b0);
        std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_12b0);
        if (local_12b0 != local_12a0) {
          operator_delete(local_12b0,local_12a0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1260._M_dataplus._M_p != &local_1260.field_2) {
          operator_delete(local_1260._M_dataplus._M_p,local_1260.field_2._M_allocated_capacity + 1);
        }
        pcVar4 = fgets((char *)local_1038,0xfff,local_1240);
      } while (pcVar4 != (char *)0x0);
    }
    iVar3 = fclose(local_1240);
    return (string *)CONCAT44(extraout_var,iVar3);
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_1038,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
             ,0x1be);
  poVar7 = LogMessage::stream(local_1038);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Check failed: fp != NULL ",0x19);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,": couldn\'t open",0xf);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1038);
}

Assistant:

static inline string Munge(const string& filename) {
  FILE* fp = fopen(filename.c_str(), "rb");
  CHECK(fp != NULL) << filename << ": couldn't open";
  char buf[4096];
  string result;
  while (fgets(buf, 4095, fp)) {
    string line = MungeLine(buf);
    char null_str[256];
    char ptr_str[256];
    sprintf(null_str, "%p", static_cast<void*>(NULL));
    sprintf(ptr_str, "%p", reinterpret_cast<void*>(PTR_TEST_VALUE));

    StringReplace(&line, "__NULLP__", null_str);
    StringReplace(&line, "__PTRTEST__", ptr_str);

    StringReplace(&line, "__SUCCESS__", StrError(0));
    StringReplace(&line, "__ENOENT__", StrError(ENOENT));
    StringReplace(&line, "__EINTR__", StrError(EINTR));
    StringReplace(&line, "__ENXIO__", StrError(ENXIO));
    StringReplace(&line, "__ENOEXEC__", StrError(ENOEXEC));
    result += line + "\n";
  }
  fclose(fp);
  return result;
}